

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<FileHeader>::copyAppend
          (QGenericArrayOps<FileHeader> *this,FileHeader *b,FileHeader *e)

{
  qsizetype *pqVar1;
  FileHeader *pFVar2;
  
  if (b != e) {
    pFVar2 = (this->super_QArrayDataPointer<FileHeader>).ptr;
    for (; b < e; b = b + 1) {
      FileHeader::FileHeader(pFVar2 + (this->super_QArrayDataPointer<FileHeader>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<FileHeader>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }